

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O2

int Map_LibraryGetMaxSuperPi_rec(Map_Super_t *pGate)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  
  if (pGate->pRoot == (Mio_Gate_t *)0x0) {
    iVar3 = pGate->Num;
  }
  else {
    uVar1 = *(uint *)&pGate->field_0x4;
    iVar3 = 0;
    for (uVar4 = 0; (uVar1 >> 2 & 7) != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = Map_LibraryGetMaxSuperPi_rec(pGate->pFanins[uVar4]);
      if (iVar3 <= iVar2) {
        iVar3 = iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

int Map_LibraryGetMaxSuperPi_rec( Map_Super_t * pGate )
{
    int i, VarCur, VarMax = 0;
    if ( pGate->pRoot == NULL )
        return pGate->Num;
    for ( i = 0; i < (int)pGate->nFanins; i++ )
    {
        VarCur = Map_LibraryGetMaxSuperPi_rec( pGate->pFanins[i] );
        if ( VarMax < VarCur )
            VarMax = VarCur;
    }
    return VarMax;
}